

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.hpp
# Opt level: O3

string * __thiscall
VolumeFile::normalizeFilePath(string *__return_storage_ptr__,VolumeFile *this,string *path)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string normalizeFilePath(const std::string& path) const
	{
		return path;
	}